

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O1

void __thiscall FNodeBuilder::FindUsedVertices(FNodeBuilder *this,vertex_t *oldverts,int max)

{
  line_t *plVar1;
  int iVar2;
  int *__s;
  FLevel *pFVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  FPrivVert newvert;
  undefined4 local_40;
  undefined4 local_3c;
  
  uVar6 = 0xffffffffffffffff;
  if (-1 < max) {
    uVar6 = (long)max * 4;
  }
  __s = (int *)operator_new__(uVar6);
  memset(__s,0xff,(long)max * 4);
  pFVar3 = this->Level;
  if (0 < pFVar3->NumLines) {
    lVar8 = 8;
    lVar5 = 0;
    do {
      lVar9 = *(long *)((long)pFVar3->Lines->args + lVar8 + -0x2c);
      lVar4 = *(long *)((long)pFVar3->Lines->args + lVar8 + -0x34) - (long)oldverts;
      lVar7 = (lVar4 >> 1) * 0x6db6db6db6db6db7;
      if (*(int *)((long)__s + lVar7) == -1) {
        local_40 = SUB84(*(double *)((long)oldverts + lVar4) + 103079215104.0,0);
        local_3c = SUB84(*(double *)((long)oldverts + lVar4 + 8) + 103079215104.0,0);
        iVar2 = (*this->VertexMap->_vptr_IVertexMap[2])(this->VertexMap,&local_40);
        *(int *)((long)__s + lVar7) = iVar2;
      }
      lVar9 = lVar9 - (long)oldverts;
      lVar4 = (lVar9 >> 1) * 0x6db6db6db6db6db7;
      if (*(int *)((long)__s + lVar4) == -1) {
        local_40 = SUB84(*(double *)((long)oldverts + lVar9) + 103079215104.0,0);
        local_3c = SUB84(*(double *)((long)oldverts + lVar9 + 8) + 103079215104.0,0);
        iVar2 = (*this->VertexMap->_vptr_IVertexMap[2])(this->VertexMap,&local_40);
        *(int *)((long)__s + lVar4) = iVar2;
      }
      plVar1 = this->Level->Lines;
      *(long *)((long)plVar1->args + lVar8 + -0x34) = (long)*(int *)((long)__s + lVar7);
      *(long *)((long)plVar1->args + lVar8 + -0x2c) = (long)*(int *)((long)__s + lVar4);
      lVar5 = lVar5 + 1;
      pFVar3 = this->Level;
      lVar8 = lVar8 + 0x98;
    } while (lVar5 < pFVar3->NumLines);
  }
  this->OldVertexTable = __s;
  return;
}

Assistant:

void FNodeBuilder::FindUsedVertices (vertex_t *oldverts, int max)
{
	int *map = new int[max];
	int i;
	FPrivVert newvert;

	memset (&map[0], -1, sizeof(int)*max);

	for (i = 0; i < Level.NumLines; ++i)
	{
		ptrdiff_t v1 = Level.Lines[i].v1 - oldverts;
		ptrdiff_t v2 = Level.Lines[i].v2 - oldverts;

		if (map[v1] == -1)
		{
			newvert.x = oldverts[v1].fixX();
			newvert.y = oldverts[v1].fixY();
			map[v1] = VertexMap->SelectVertexExact (newvert);
		}
		if (map[v2] == -1)
		{
			newvert.x = oldverts[v2].fixX();
			newvert.y = oldverts[v2].fixY();
			map[v2] = VertexMap->SelectVertexExact (newvert);
		}

		Level.Lines[i].v1 = (vertex_t *)(size_t)map[v1];
		Level.Lines[i].v2 = (vertex_t *)(size_t)map[v2];
	}
	OldVertexTable = map;
}